

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O0

VarnodeData * __thiscall PcodeCacher::expandPool(PcodeCacher *this,uint4 size)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  VarnodeData *pVVar8;
  VarnodeData *pVVar9;
  size_type sVar10;
  reference pvVar11;
  long lVar12;
  reference pRVar13;
  VarnodeData *pVVar14;
  VarnodeData *ref;
  _List_node_base *local_60;
  _List_iterator<RelativeRecord> local_58;
  iterator iter;
  VarnodeData *invar;
  VarnodeData *outvar;
  uint4 i_1;
  uint4 i;
  VarnodeData *newpool;
  uint local_28;
  uint4 newsize;
  uint4 increase;
  uint4 cursize;
  uint4 curmax;
  uint4 size_local;
  PcodeCacher *this_local;
  
  uVar4 = (uint)(((long)this->endpool - (long)this->poolstart) / 0x18);
  uVar6 = ((long)this->curpool - (long)this->poolstart) / 0x18;
  uVar5 = (uint)uVar6;
  if (uVar4 < uVar5 + size) {
    local_28 = (uVar5 + size) - uVar4;
    if (local_28 < 100) {
      local_28 = 100;
    }
    auVar1 = ZEXT416(uVar4 + local_28) * ZEXT816(0x18);
    uVar7 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pVVar8 = (VarnodeData *)operator_new__(uVar7);
    for (outvar._4_4_ = 0; outvar._4_4_ < uVar5; outvar._4_4_ = outvar._4_4_ + 1) {
      pVVar14 = this->poolstart + outvar._4_4_;
      pVVar9 = pVVar8 + outvar._4_4_;
      pVVar9->space = pVVar14->space;
      pVVar9->offset = pVVar14->offset;
      uVar2 = *(undefined4 *)&pVVar14->field_0x14;
      pVVar9->size = pVVar14->size;
      *(undefined4 *)&pVVar9->field_0x14 = uVar2;
    }
    outvar._0_4_ = 0;
    while( true ) {
      sVar10 = std::vector<PcodeData,_std::allocator<PcodeData>_>::size(&this->issued);
      if (sVar10 <= (uint)outvar) break;
      pvVar11 = std::vector<PcodeData,_std::allocator<PcodeData>_>::operator[]
                          (&this->issued,(ulong)(uint)outvar);
      pVVar9 = pvVar11->outvar;
      if (pVVar9 != (VarnodeData *)0x0) {
        pVVar14 = this->poolstart;
        pvVar11 = std::vector<PcodeData,_std::allocator<PcodeData>_>::operator[]
                            (&this->issued,(ulong)(uint)outvar);
        pvVar11->outvar = pVVar8 + ((long)pVVar9 - (long)pVVar14) / 0x18;
      }
      pvVar11 = std::vector<PcodeData,_std::allocator<PcodeData>_>::operator[]
                          (&this->issued,(ulong)(uint)outvar);
      iter._M_node = (_List_node_base *)pvVar11->invar;
      if ((VarnodeData *)iter._M_node != (VarnodeData *)0x0) {
        lVar12 = (long)iter._M_node - (long)this->poolstart;
        iter._M_node = (_List_node_base *)(pVVar8 + lVar12 / 0x18);
        pvVar11 = std::vector<PcodeData,_std::allocator<PcodeData>_>::operator[]
                            (&this->issued,(ulong)(uint)outvar);
        pvVar11->invar = pVVar8 + lVar12 / 0x18;
      }
      outvar._0_4_ = (uint)outvar + 1;
    }
    std::_List_iterator<RelativeRecord>::_List_iterator(&local_58);
    local_60 = (_List_node_base *)
               std::__cxx11::list<RelativeRecord,_std::allocator<RelativeRecord>_>::begin
                         (&this->label_refs);
    local_58._M_node = local_60;
    while( true ) {
      ref = (VarnodeData *)
            std::__cxx11::list<RelativeRecord,_std::allocator<RelativeRecord>_>::end
                      (&this->label_refs);
      bVar3 = std::operator!=(&local_58,(_Self *)&ref);
      if (!bVar3) break;
      pRVar13 = std::_List_iterator<RelativeRecord>::operator*(&local_58);
      pVVar9 = pRVar13->dataptr;
      pVVar14 = this->poolstart;
      pRVar13 = std::_List_iterator<RelativeRecord>::operator*(&local_58);
      pRVar13->dataptr = pVVar8 + ((long)pVVar9 - (long)pVVar14) / 0x18;
      std::_List_iterator<RelativeRecord>::operator++(&local_58);
    }
    if (this->poolstart != (VarnodeData *)0x0) {
      operator_delete__(this->poolstart);
    }
    this->poolstart = pVVar8;
    this->curpool = pVVar8 + (uVar5 + size);
    this->endpool = pVVar8 + (uVar4 + local_28);
    this_local = (PcodeCacher *)(pVVar8 + (uVar6 & 0xffffffff));
  }
  else {
    this_local = (PcodeCacher *)this->curpool;
  }
  return (VarnodeData *)this_local;
}

Assistant:

VarnodeData *PcodeCacher::expandPool(uint4 size)

{ // Expand the pool so that -size- more elements fit
  // Return pointer to first available element
  uint4 curmax = endpool - poolstart;
  uint4 cursize = curpool - poolstart;
  if (cursize + size <= curmax)
    return curpool;		// No expansion necessary
  uint4 increase = (cursize + size) - curmax;
  if (increase < 100)		// Increase by at least 100
    increase = 100;

  uint4 newsize = curmax + increase;

  VarnodeData *newpool = new VarnodeData[newsize];
  for(uint4 i=0;i<cursize;++i)
    newpool[i] = poolstart[i];	// Copy old data
  // Update references to the old pool
  for(uint4 i=0;i<issued.size();++i) {
    VarnodeData *outvar = issued[i].outvar;
    if (outvar != (VarnodeData *)0) {
      outvar = newpool + (outvar - poolstart);
      issued[i].outvar = outvar;
    }
    VarnodeData *invar = issued[i].invar;
    if (invar != (VarnodeData *)0) {
      invar = newpool + (invar - poolstart);
      issued[i].invar = invar;
    }
  }
  list<RelativeRecord>::iterator iter;
  for(iter=label_refs.begin();iter!=label_refs.end();++iter) {
    VarnodeData *ref = (*iter).dataptr;
    (*iter).dataptr = newpool + (ref - poolstart);
  }
  
  delete [] poolstart;		// Free up old pool
  poolstart = newpool;
  curpool = newpool + (cursize + size);
  endpool = newpool + newsize;
  return newpool + cursize;
}